

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O1

void __thiscall spectest::JSONParser::PrintError(JSONParser *this,char *format,...)

{
  uint uVar1;
  uint uVar2;
  char *pcVar3;
  size_t sVar4;
  long lVar5;
  FILE *__stream;
  long *plVar6;
  int iVar7;
  size_t __maxlen;
  char *__s;
  undefined8 uStack_1c0;
  char local_1b8 [8];
  char fixed_buf [128];
  undefined8 local_88;
  va_list args;
  long *local_68 [2];
  long local_58 [2];
  undefined8 local_48;
  va_list args_copy;
  
  args[0].overflow_arg_area = fixed_buf + 0x78;
  local_88 = 0x3000000010;
  args[0]._0_8_ = &stack0x00000008;
  local_48 = 0x3000000010;
  __s = local_1b8;
  uStack_1c0 = 0x11b5e4;
  args_copy[0]._0_8_ = args[0]._0_8_;
  args_copy[0].overflow_arg_area = args[0].overflow_arg_area;
  iVar7 = vsnprintf(__s,0x80,format,&local_88);
  __maxlen = (long)iVar7 + 1;
  if (0x80 < __maxlen) {
    lVar5 = -((long)iVar7 + 0x10U & 0xfffffffffffffff0);
    __s = local_1b8 + lVar5;
    *(undefined8 *)((long)&uStack_1c0 + lVar5) = 0x11b613;
    vsnprintf(__s,__maxlen,format,&local_48);
  }
  __stream = _stderr;
  pcVar3 = (this->loc_).filename._M_str;
  sVar4 = (this->loc_).filename._M_len;
  local_68[0] = local_58;
  __s[-8] = '<';
  __s[-7] = -0x4a;
  __s[-6] = '\x11';
  __s[-5] = '\0';
  __s[-4] = '\0';
  __s[-3] = '\0';
  __s[-2] = '\0';
  __s[-1] = '\0';
  std::__cxx11::string::_M_construct<char_const*>((string *)local_68,pcVar3,pcVar3 + sVar4);
  plVar6 = local_68[0];
  uVar1 = (this->loc_).field_1.field_0.line;
  uVar2 = (this->loc_).field_1.field_0.first_column;
  __s[-8] = '[';
  __s[-7] = -0x4a;
  __s[-6] = '\x11';
  __s[-5] = '\0';
  __s[-4] = '\0';
  __s[-3] = '\0';
  __s[-2] = '\0';
  __s[-1] = '\0';
  fprintf(__stream,"%s:%d:%d: %s\n",plVar6,(ulong)uVar1,(ulong)uVar2,__s);
  plVar6 = local_68[0];
  if (local_68[0] != local_58) {
    __s[-8] = 'p';
    __s[-7] = -0x4a;
    __s[-6] = '\x11';
    __s[-5] = '\0';
    __s[-4] = '\0';
    __s[-3] = '\0';
    __s[-2] = '\0';
    __s[-1] = '\0';
    operator_delete(plVar6,local_58[0] + 1);
  }
  return;
}

Assistant:

void JSONParser::PrintError(const char* format, ...) {
  WABT_SNPRINTF_ALLOCA(buffer, length, format);
  fprintf(stderr, "%s:%d:%d: %s\n", std::string(loc_.filename).c_str(),
          loc_.line, loc_.first_column, buffer);
}